

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_keyword_is_write(NGP_TOKEN *ngp_tok)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *__s;
  long lVar7;
  
  if (ngp_tok == (NGP_TOKEN *)0x0) {
    return 0x16a;
  }
  pcVar6 = ngp_tok->name;
  lVar7 = 0;
  do {
    iVar3 = strcmp(*(char **)((long)ngp_keyword_is_write::nmni + lVar7),pcVar6);
    if (iVar3 == 0) {
      return 0x170;
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x50);
  __s = "NAXIS";
  lVar7 = 1;
  do {
    sVar5 = strlen(__s);
    iVar3 = (int)sVar5;
    if (0xfffffffa < iVar3 - 6U) {
      iVar4 = strncmp(__s,pcVar6,sVar5 & 0xffffffff);
      if (iVar4 == 0) {
        if ((byte)(pcVar6[sVar5 & 0xffffffff] - 0x3aU) < 0xf7) {
          return 0;
        }
        if (iVar3 < 7) {
          iVar3 = iVar3 + -1;
          pcVar6 = ngp_tok->name + (sVar5 & 0xffffffff) + 1;
          bVar2 = false;
          do {
            cVar1 = *pcVar6;
            if (bVar2) {
              bVar2 = true;
              if (cVar1 != ' ') {
                return 0;
              }
            }
            else {
              bVar2 = false;
              if ((9 < (byte)(cVar1 - 0x30U)) && (bVar2 = true, cVar1 != ' ')) {
                if (cVar1 != '\0') {
                  return 0;
                }
                return 0x170;
              }
            }
            iVar3 = iVar3 + 1;
            pcVar6 = pcVar6 + 1;
            if (5 < iVar3) {
              return 0x170;
            }
          } while( true );
        }
        return 0x170;
      }
    }
    __s = ngp_keyword_is_write::nm[lVar7];
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int	ngp_keyword_is_write(NGP_TOKEN *ngp_tok)
 { int i, j, l, spc;
                        /* indexed variables not to write */

   static char *nm[] = { "NAXIS", "TFORM", "TTYPE", NULL } ;

                        /* non indexed variables not allowed to write */
  
   static char *nmni[] = { "SIMPLE", "XTENSION", "BITPIX", "NAXIS", "PCOUNT",
                           "GCOUNT", "TFIELDS", "THEAP", "EXTEND", "EXTVER",
                           NULL } ;

   if (NULL == ngp_tok) return(NGP_NUL_PTR);

   for (j = 0; ; j++)           /* first check non indexed */
    { if (NULL == nmni[j]) break;
      if (0 == strcmp(nmni[j], ngp_tok->name)) return(NGP_BAD_ARG);
    } 

   for (j = 0; ; j++)           /* now check indexed */
    { if (NULL == nm[j]) return(NGP_OK);
      l = strlen(nm[j]);
      if ((l < 1) || (l > 5)) continue;
      if (0 == strncmp(nm[j], ngp_tok->name, l)) break;
    } 

   if ((ngp_tok->name[l] < '1') || (ngp_tok->name[l] > '9')) return(NGP_OK);
   spc = 0;
   for (i = l + 1; i < 8; i++)
    { if (spc) { if (' ' != ngp_tok->name[i]) return(NGP_OK); }
      else
       { if ((ngp_tok->name[i] >= '0') && (ngp_tok->name[i] <= '9')) continue;
         if (' ' == ngp_tok->name[i]) { spc = 1; continue; }
         if (0 == ngp_tok->name[i]) break;
         return(NGP_OK);
       }
    }
   return(NGP_BAD_ARG);
 }